

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O0

PVector * NewVector(uint size)

{
  PClass *len;
  PType *local_20;
  PType *type;
  size_t bucket;
  uint size_local;
  
  len = PVector::RegistrationInfo.MyClass;
  bucket._4_4_ = size;
  local_20 = FTypeTable::FindType
                       (&TypeTable,PVector::RegistrationInfo.MyClass,(intptr_t)TypeFloat32,
                        (ulong)size,(size_t *)&type);
  if (local_20 == (PType *)0x0) {
    local_20 = (PType *)DObject::operator_new((DObject *)0x90,(size_t)len);
    PVector::PVector((PVector *)local_20,bucket._4_4_);
    FTypeTable::AddType(&TypeTable,local_20,PVector::RegistrationInfo.MyClass,(intptr_t)TypeFloat32,
                        (ulong)bucket._4_4_,(size_t)type);
  }
  return (PVector *)local_20;
}

Assistant:

PVector *NewVector(unsigned int size)
{
	size_t bucket;
	PType *type = TypeTable.FindType(RUNTIME_CLASS(PVector), (intptr_t)TypeFloat32, size, &bucket);
	if (type == NULL)
	{
		type = new PVector(size);
		TypeTable.AddType(type, RUNTIME_CLASS(PVector), (intptr_t)TypeFloat32, size, bucket);
	}
	return (PVector *)type;
}